

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

void __thiscall
QTemporaryFileName::QTemporaryFileName(QTemporaryFileName *this,QString *templateName)

{
  QLatin1StringView str;
  bool bVar1;
  char *pcVar2;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype phLength;
  qsizetype phPos;
  NativePath filename;
  QString qfilename;
  QString *in_stack_fffffffffffffee8;
  QFileSystemEntry *in_stack_fffffffffffffef0;
  QFileSystemEntry *in_stack_fffffffffffffef8;
  qsizetype in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  bool local_e9;
  long local_c0;
  long local_b8;
  QByteArray local_78;
  QChar local_5c;
  QChar local_5a;
  QString local_58 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray((QByteArray *)0x2f77c3);
  local_58[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators(in_stack_fffffffffffffee8);
  local_b8 = QString::size(local_58);
  local_c0 = 0;
  while (local_b8 != 0) {
    local_b8 = local_b8 + -1;
    QString::operator[](in_stack_fffffffffffffee8,0x2f783e);
    QChar::QChar<char16_t,_true>(&local_5a,L'X');
    bVar1 = ::operator==((QChar *)in_stack_fffffffffffffef0,(QChar *)in_stack_fffffffffffffee8);
    if (bVar1) {
      local_c0 = local_c0 + 1;
    }
    else {
      local_e9 = true;
      if (local_c0 < 6) {
        in_stack_ffffffffffffff08 =
             (QString *)QString::operator[](in_stack_fffffffffffffee8,0x2f78cd);
        QChar::QChar<char16_t,_true>(&local_5c,L'/');
        local_e9 = ::operator==((QChar *)in_stack_fffffffffffffef0,
                                (QChar *)in_stack_fffffffffffffee8);
      }
      if (local_e9 != false) break;
      local_c0 = 0;
    }
  }
  if (local_c0 < 6) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
    str.m_data = (char *)in_stack_ffffffffffffff08;
    str.m_size = in_stack_ffffffffffffff00;
    QString::append(in_stack_fffffffffffffee8,str);
  }
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QDir::cleanPath(in_stack_ffffffffffffff08);
  QFileSystemEntry::QFileSystemEntry(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  QFileSystemEntry::nativeFilePath(in_stack_fffffffffffffef8);
  QFileSystemEntry::~QFileSystemEntry(in_stack_fffffffffffffef0);
  QString::~QString((QString *)0x2f79e2);
  local_b8 = QByteArray::size(&local_78);
  local_c0 = 0;
  while (local_b8 != 0) {
    pcVar2 = QByteArray::operator[]((QByteArray *)in_stack_fffffffffffffee8,0x2f7a28);
    if (*pcVar2 == 'X') {
      local_c0 = local_c0 + 1;
      local_b8 = local_b8 + -1;
    }
    else {
      if (5 < local_c0) break;
      local_c0 = 0;
      local_b8 = local_b8 + -1;
    }
  }
  QByteArray::operator=
            ((QByteArray *)in_stack_fffffffffffffef0,(QByteArray *)in_stack_fffffffffffffee8);
  *(long *)(in_RDI + 0x18) = local_b8;
  *(long *)(in_RDI + 0x20) = local_c0;
  QByteArray::~QByteArray((QByteArray *)0x2f7b13);
  QString::~QString((QString *)0x2f7b20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTemporaryFileName::QTemporaryFileName(const QString &templateName)
{
    // Ensure there is a placeholder mask
    QString qfilename = QDir::fromNativeSeparators(templateName);
    qsizetype phPos = qfilename.size();
    qsizetype phLength = 0;

    while (phPos != 0) {
        --phPos;

        if (qfilename[phPos] == u'X') {
            ++phLength;
            continue;
        }

        if (phLength >= 6
                || qfilename[phPos] == u'/') {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    if (phLength < 6)
        qfilename.append(".XXXXXX"_L1);

    // "Nativify" :-)
    QFileSystemEntry::NativePath filename =
            QFileSystemEntry(QDir::cleanPath(qfilename)).nativeFilePath();

    // Find mask in native path
    phPos = filename.size();
    phLength = 0;
    while (phPos != 0) {
        --phPos;

        if (filename[phPos] == Latin1Char('X')) {
            ++phLength;
            continue;
        }

        if (phLength >= 6) {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    Q_ASSERT(phLength >= 6);
    path = filename;
    pos = phPos;
    length = phLength;
}